

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightstobin.cpp
# Opt level: O0

void doit(void)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_1018 [4];
  undefined1 auStack_1014 [4];
  VulnerabilityWeight vw;
  int lineno;
  char line [4096];
  
  fgets((char *)&vw.weight,0x1000,_stdin);
  vw.vulnerability_id = 2;
  while( true ) {
    pcVar2 = fgets((char *)&vw.weight,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(&vw.weight,"%d,%d,%f",local_1018,auStack_1014,&vw);
    if (iVar1 != 3) break;
    fwrite(local_1018,0xc,1,_stdout);
    vw.vulnerability_id = vw.vulnerability_id + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)(uint)vw.vulnerability_id,&vw.weight)
  ;
  exit(1);
}

Assistant:

void doit() {

  char line[4096];
  fgets(line, sizeof(line), stdin);   // skip header
  int lineno = 2;
  VulnerabilityWeight vw;

  while (fgets(line, sizeof(line), stdin) != 0) {

    if (sscanf(line, "%d,%d,%f", &vw.areaperil_id, &vw.vulnerability_id,
				 &vw.weight) != 3) {
      fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
      exit(EXIT_FAILURE);
    }

    fwrite(&vw, sizeof(vw), 1, stdout);
    lineno++;

  }

}